

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O2

void test_single<unsigned_long_long>(void)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  write_int_to_stream<unsigned_long_long> local_4c8;
  write_int_to_stream<unsigned_long_long> local_4c0;
  write_int_to_stream<unsigned_long_long> local_4b8;
  write_int_to_stream<unsigned_long_long> local_4b0;
  write_int_to_stream<unsigned_long_long> local_4a8;
  write_int_to_stream<unsigned_long_long> local_4a0;
  write_int_to_stream<unsigned_long_long> local_498;
  ostringstream oss;
  ostringstream a;
  ostringstream b;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&a);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&b);
  _oss = (pointer)0x0;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            ((write_int_to_stream<unsigned_long_long> *)&oss,(ostream *)&a);
  poVar3 = std::operator<<((ostream *)&a," ");
  local_4e8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()
            ((write_int_to_stream<unsigned_long_long> *)&local_4e8,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_498.v = 1;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_498,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_4a0.v = 0;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_4a0,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_4a8.v = 0xffffffffffffffff;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_4a8,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_4b0.v = 10;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_4b0,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_4b8.v = 0xfffffffffffffff6;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_4b8,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_4c0.v = 0x3039;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_4c0,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_4c8.v = 0xffffffffffffcfc7;
  cppcms::impl::details::write_int_to_stream<unsigned_long_long>::operator()(&local_4c8,poVar3);
  std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&b);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::operator<<(poVar3," ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          &local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error!!! \n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&oss);
    poVar3 = std::operator<<(poVar3,"\n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_4e8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&oss);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
      std::operator<<(poVar3," a.str() == b.str()");
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,(string *)&local_4e8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok       \n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&oss);
    poVar3 = std::operator<<(poVar3,"\n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_4e8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&oss);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&b);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&a);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}